

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>::
Block(Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>
      *this,Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *xpr,Index startRow,
     Index startCol,Index blockRows,Index blockCols)

{
  internal::
  BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false,_true>
  ::BlockImpl_dense((BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false,_true>
                     *)this,xpr,startRow,startCol,blockRows,blockCols);
  if (blockRows != 2) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = 2, BlockCols = -1, InnerPanel = false]"
                 );
  }
  if ((((-1 < startRow) && (-1 < (blockCols | startCol))) &&
      (startRow <=
       (xpr->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
       .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
       super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
       m_rows.m_value + -2)) &&
     (startCol <=
      (xpr->super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value - blockCols)) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, 2>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = 2, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }